

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O2

MPP_RET vcodec_service_set_info(void *ctx,MppDevInfoCfg *cfg)

{
  undefined8 *puVar1;
  int iVar2;
  RK_U64 RVar3;
  
  iVar2 = *(int *)((long)ctx + 0x208);
  if ((long)iVar2 == 0) {
    memset((void *)((long)ctx + 0x210),0,0x100);
  }
  else if (0xf < iVar2) {
    _mpp_log_l(2,"vcodec_service","info count reach max\n",(char *)0x0);
    return MPP_NOK;
  }
  RVar3 = cfg->data;
  puVar1 = (undefined8 *)((long)ctx + (long)iVar2 * 0x10 + 0x210);
  *puVar1 = *(undefined8 *)cfg;
  puVar1[1] = RVar3;
  *(int *)((long)ctx + 0x208) = *(int *)((long)ctx + 0x208) + 1;
  if (cfg->type == 3) {
    *(RK_U64 *)((long)ctx + 8) = cfg->data;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vcodec_service_set_info(void *ctx, MppDevInfoCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;

    if (!p->info_count)
        memset(p->info, 0, sizeof(p->info));

    if (p->info_count >= MAX_INFO_COUNT) {
        mpp_err("info count reach max\n");
        return MPP_NOK;
    }

    memcpy(&p->info[p->info_count], cfg, sizeof(MppDevInfoCfg));
    p->info_count++;

    if (cfg->type == INFO_FORMAT_TYPE) {
        p->fmt = cfg->data;
    }
    return MPP_OK;
}